

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O2

int uv_tcp_listen(uv_tcp_t *tcp,int backlog,uv_connection_cb cb)

{
  byte *pbVar1;
  int iVar2;
  char *__nptr;
  int *piVar3;
  
  if (tcp->delayed_error == 0) {
    if (uv_tcp_listen::single_accept == -1) {
      __nptr = getenv("UV_TCP_SINGLE_ACCEPT");
      if (__nptr == (char *)0x0) {
        uv_tcp_listen::single_accept = 0;
      }
      else {
        iVar2 = atoi(__nptr);
        uv_tcp_listen::single_accept = (int)(iVar2 != 0);
      }
    }
    if (uv_tcp_listen::single_accept != 0) {
      pbVar1 = (byte *)((long)&tcp->flags + 1);
      *pbVar1 = *pbVar1 | 0x10;
    }
    iVar2 = maybe_new_socket(tcp,2,0x20);
    if (iVar2 == 0) {
      iVar2 = listen((tcp->io_watcher).fd,backlog);
      if (iVar2 == 0) {
        tcp->connection_cb = cb;
        (tcp->io_watcher).cb = uv__server_io;
        uv__io_start(tcp->loop,&tcp->io_watcher,1);
        iVar2 = 0;
      }
      else {
        piVar3 = __errno_location();
        iVar2 = -*piVar3;
      }
    }
    return iVar2;
  }
  return tcp->delayed_error;
}

Assistant:

int uv_tcp_listen(uv_tcp_t* tcp, int backlog, uv_connection_cb cb) {
  static int single_accept = -1;
  int err;

  if (tcp->delayed_error)
    return tcp->delayed_error;

  if (single_accept == -1) {
    const char* val = getenv("UV_TCP_SINGLE_ACCEPT");
    single_accept = (val != NULL && atoi(val) != 0);  /* Off by default. */
  }

  if (single_accept)
    tcp->flags |= UV_TCP_SINGLE_ACCEPT;

  err = maybe_new_socket(tcp, AF_INET, UV_STREAM_READABLE);
  if (err)
    return err;

  if (listen(tcp->io_watcher.fd, backlog))
    return -errno;

  tcp->connection_cb = cb;

  /* Start listening for connections. */
  tcp->io_watcher.cb = uv__server_io;
  uv__io_start(tcp->loop, &tcp->io_watcher, UV__POLLIN);

  return 0;
}